

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutex.h
# Opt level: O0

int32_t icu_63::umtx_atomic_inc(u_atomic_int32_t *var)

{
  int iVar1;
  u_atomic_int32_t *var_local;
  
  LOCK();
  iVar1 = (var->super___atomic_base<int>)._M_i;
  (var->super___atomic_base<int>)._M_i = (var->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  return iVar1 + 1;
}

Assistant:

inline int32_t umtx_atomic_inc(u_atomic_int32_t *var) {
    return var->fetch_add(1) + 1;
}